

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ClockVarSymbol::serializeTo(ClockVarSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  string_view name;
  string_view name_00;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  __n = strlen(*(char **)(toString(slang::ast::ArgumentDirection)::strings +
                         (long)(int)this->direction * 8));
  ASTSerializer::write(serializer,9,"direction",__n);
  if (((this->inputSkew).delay != (TimingControl *)0x0) || ((this->inputSkew).edge != None)) {
    name._M_str = "inputSkew";
    name._M_len = 9;
    ASTSerializer::writeProperty(serializer,name);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&this->inputSkew,serializer);
    ASTSerializer::endObject(serializer);
  }
  if (((this->outputSkew).delay == (TimingControl *)0x0) && ((this->outputSkew).edge == None)) {
    return;
  }
  name_00._M_str = "outputSkew";
  name_00._M_len = 10;
  ASTSerializer::writeProperty(serializer,name_00);
  ASTSerializer::startObject(serializer);
  ClockingSkew::serializeTo(&this->outputSkew,serializer);
  ASTSerializer::endObject(serializer);
  return;
}

Assistant:

void ClockVarSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));

    if (inputSkew.hasValue()) {
        serializer.writeProperty("inputSkew");
        serializer.startObject();
        inputSkew.serializeTo(serializer);
        serializer.endObject();
    }

    if (outputSkew.hasValue()) {
        serializer.writeProperty("outputSkew");
        serializer.startObject();
        outputSkew.serializeTo(serializer);
        serializer.endObject();
    }
}